

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O3

size_t sftp_chan_send(Channel *chan,_Bool is_stderr,void *data,size_t length)

{
  bufchain *ch;
  size_t sVar1;
  sftp_packet *pkt;
  sftp_packet *pkt_00;
  uint length_00;
  char lenbuf [4];
  uint local_2c;
  
  ch = (bufchain *)(chan + -4);
  bufchain_add(ch,data,length);
  sVar1 = bufchain_size(ch);
  if (3 < sVar1) {
    do {
      bufchain_fetch(ch,&local_2c,4);
      length_00 = local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
                  local_2c << 0x18;
      sVar1 = bufchain_size(ch);
      if (sVar1 - 4 < (ulong)length_00) {
        return 0;
      }
      bufchain_consume(ch,4);
      pkt = sftp_recv_prepare(length_00);
      bufchain_fetch_consume(ch,pkt->data,(ulong)length_00);
      sftp_recv_finish(pkt);
      pkt_00 = sftp_handle_request(*(SftpServer **)&chan[-2].initial_fixed_window_size,pkt);
      sftp_pkt_free(pkt);
      sftp_send_prepare(pkt_00);
      (**(code **)**(undefined8 **)&chan[-0x5e].initial_fixed_window_size)
                (*(undefined8 **)&chan[-0x5e].initial_fixed_window_size,0,pkt_00->data,
                 pkt_00->length);
      sftp_pkt_free(pkt_00);
      sVar1 = bufchain_size(ch);
    } while (3 < sVar1);
  }
  return 0;
}

Assistant:

static size_t sftp_chan_send(Channel *chan, bool is_stderr,
                             const void *data, size_t length)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    bufchain_add(&sess->subsys_input, data, length);

    while (bufchain_size(&sess->subsys_input) >= 4) {
        char lenbuf[4];
        unsigned pktlen;
        struct sftp_packet *pkt, *reply;

        bufchain_fetch(&sess->subsys_input, lenbuf, 4);
        pktlen = GET_32BIT_MSB_FIRST(lenbuf);

        if (bufchain_size(&sess->subsys_input) - 4 < pktlen)
            break;                     /* wait for more data */

        bufchain_consume(&sess->subsys_input, 4);
        pkt = sftp_recv_prepare(pktlen);
        bufchain_fetch_consume(&sess->subsys_input, pkt->data, pktlen);
        sftp_recv_finish(pkt);
        reply = sftp_handle_request(sess->sftpsrv, pkt);
        sftp_pkt_free(pkt);

        sftp_send_prepare(reply);
        sshfwd_write(sess->c, reply->data, reply->length);
        sftp_pkt_free(reply);
    }

    return 0;
}